

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

void __thiscall basisu::basisu_frontend::generate_endpoint_clusters(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *parent_codebook;
  uint8_vec *this_00;
  job_pool *pjVar1;
  bool bVar2;
  uint uVar3;
  vector<unsigned_int> *pvVar4;
  uint *puVar5;
  uchar *puVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t parent_cluster_index;
  uchar uVar9;
  uchar uVar10;
  uint32_t i;
  ulong uVar11;
  value_type_conflict3 local_41;
  uint local_40;
  uint local_3c;
  vector<basisu::vector<unsigned_int>_> *local_38;
  
  uVar8 = 0;
  debug_printf("Begin endpoint quantization\n");
  uVar7 = (this->m_params).m_max_endpoint_clusters;
  if ((this->m_params).m_multithreaded == true) {
    uVar3 = std::thread::hardware_concurrency();
    uVar8 = 8;
    if ((int)uVar3 < 8) {
      uVar8 = (ulong)uVar3;
    }
  }
  pjVar1 = (this->m_params).m_pJob_pool;
  if (pjVar1 != (job_pool *)0x0) {
    uVar3 = (int)((ulong)((long)(pjVar1->m_threads).
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pjVar1->m_threads).
                               super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3) + 1;
    if ((int)(uint)uVar8 <= (int)uVar3) {
      uVar3 = (uint)uVar8;
    }
    uVar8 = (ulong)uVar3;
  }
  debug_printf("max_threads: %u\n",uVar8);
  local_38 = &this->m_endpoint_clusters;
  parent_codebook = &this->m_endpoint_parent_clusters;
  bVar2 = generate_hierarchical_codebook_threaded<basisu::tree_vector_quant<basisu::vec<6u,float>>>
                    (&this->m_endpoint_clusterizer,(this->m_params).m_max_endpoint_clusters,
                     (uint)(byte)(0xff < uVar7 & this->m_use_hierarchical_endpoint_codebooks) << 4,
                     local_38,parent_codebook,(uint32_t)uVar8,(this->m_params).m_pJob_pool,true);
  if (!bVar2) {
    handle_verify_failure(0x391);
  }
  if (this->m_use_hierarchical_endpoint_codebooks == true) {
    if ((this->m_endpoint_parent_clusters).m_size == 0) {
      vector<basisu::vector<unsigned_int>_>::resize(parent_codebook,0,false);
      vector<basisu::vector<unsigned_int>_>::resize(parent_codebook,1,false);
      uVar7 = 1;
      for (uVar3 = 0; uVar3 < this->m_total_blocks; uVar3 = uVar3 + 1) {
        pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](parent_codebook,0);
        local_3c = uVar7 - 1;
        vector<unsigned_int>::push_back(pvVar4,&local_3c);
        pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](parent_codebook,0);
        local_40 = uVar7;
        vector<unsigned_int>::push_back(pvVar4,&local_40);
        uVar7 = uVar7 + 2;
      }
    }
    this_00 = &this->m_block_parent_endpoint_cluster;
    vector<unsigned_char>::resize(this_00,0,false);
    vector<unsigned_char>::resize(this_00,(ulong)this->m_total_blocks,false);
    local_41 = 0xff;
    vector_set_all<basisu::vector<unsigned_char>>(this_00,&local_41);
    for (uVar8 = 0; uVar8 < (this->m_endpoint_parent_clusters).m_size; uVar8 = uVar8 + 1) {
      pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](parent_codebook,uVar8);
      for (uVar11 = 0; uVar11 < pvVar4->m_size; uVar11 = uVar11 + 1) {
        puVar5 = vector<unsigned_int>::operator[](pvVar4,uVar11);
        puVar6 = vector<unsigned_char>::operator[](this_00,(ulong)(*puVar5 >> 1));
        *puVar6 = (uchar)uVar8;
      }
    }
    uVar8 = 0;
    while (uVar8 < this->m_total_blocks) {
      puVar6 = vector<unsigned_char>::operator[](this_00,uVar8);
      uVar8 = uVar8 + 1;
      if (*puVar6 == 0xff) {
        handle_verify_failure(0x3b1);
      }
    }
    for (uVar8 = 0; uVar8 < (this->m_endpoint_clusters).m_size; uVar8 = uVar8 + 1) {
      pvVar4 = vector<basisu::vector<unsigned_int>_>::operator[](local_38,uVar8);
      uVar9 = '\0';
      for (uVar11 = 0; uVar11 < pvVar4->m_size; uVar11 = uVar11 + 1) {
        puVar5 = vector<unsigned_int>::operator[](pvVar4,uVar11);
        if ((this->m_block_parent_endpoint_cluster).m_size <= *puVar5 >> 1) {
          handle_verify_failure(0x3be);
        }
        puVar6 = vector<unsigned_char>::operator[](this_00,(ulong)(*puVar5 >> 1));
        uVar10 = *puVar6;
        if ((uVar11 != 0) && (bVar2 = uVar9 != uVar10, uVar10 = uVar9, bVar2)) {
          handle_verify_failure(0x3c6);
        }
        uVar9 = uVar10;
      }
    }
  }
  if ((this->m_params).m_debug_stats == true) {
    debug_printf("Total endpoint clusters: %u, parent clusters: %u\n",
                 (ulong)(this->m_endpoint_clusters).m_size,
                 (ulong)(this->m_endpoint_parent_clusters).m_size);
  }
  return;
}

Assistant:

void basisu_frontend::generate_endpoint_clusters()
	{
		debug_printf("Begin endpoint quantization\n");

		const uint32_t parent_codebook_size = (m_params.m_max_endpoint_clusters >= 256) ? BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE : 0;
		uint32_t max_threads = 0;
		max_threads = m_params.m_multithreaded ? minimum<int>(std::thread::hardware_concurrency(), cMaxCodebookCreationThreads) : 0;
		if (m_params.m_pJob_pool)
			max_threads = minimum<int>((int)m_params.m_pJob_pool->get_total_threads(), max_threads);

		debug_printf("max_threads: %u\n", max_threads);
		bool status = generate_hierarchical_codebook_threaded(m_endpoint_clusterizer,
			m_params.m_max_endpoint_clusters, m_use_hierarchical_endpoint_codebooks ? parent_codebook_size : 0,
			m_endpoint_clusters,
			m_endpoint_parent_clusters,
			max_threads, m_params.m_pJob_pool, true);
		BASISU_FRONTEND_VERIFY(status);

		if (m_use_hierarchical_endpoint_codebooks)
		{
			if (!m_endpoint_parent_clusters.size())
			{
				m_endpoint_parent_clusters.resize(0);
				m_endpoint_parent_clusters.resize(1);
				for (uint32_t i = 0; i < m_total_blocks; i++)
				{
					m_endpoint_parent_clusters[0].push_back(i*2);
					m_endpoint_parent_clusters[0].push_back(i*2+1);
				}
			}

			BASISU_ASSUME(BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE <= UINT8_MAX);

			m_block_parent_endpoint_cluster.resize(0);
			m_block_parent_endpoint_cluster.resize(m_total_blocks);
			vector_set_all(m_block_parent_endpoint_cluster, 0xFF);
			for (uint32_t parent_cluster_index = 0; parent_cluster_index < m_endpoint_parent_clusters.size(); parent_cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_parent_clusters[parent_cluster_index];
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					m_block_parent_endpoint_cluster[block_index] = static_cast<uint8_t>(parent_cluster_index);
				}
			}

			for (uint32_t i = 0; i < m_total_blocks; i++)
			{
				BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[i] != 0xFF);
			}

			// Ensure that all the blocks within each cluster are all in the same parent cluster, or something is very wrong.
			for (uint32_t cluster_index = 0; cluster_index < m_endpoint_clusters.size(); cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_clusters[cluster_index];
			
				uint32_t parent_cluster_index = 0;
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					
					BASISU_FRONTEND_VERIFY(block_index < m_block_parent_endpoint_cluster.size());

					if (!j)
					{
						parent_cluster_index = m_block_parent_endpoint_cluster[block_index];
					}
					else
					{
						BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[block_index] == parent_cluster_index);
					}
				}
			}
		}
								
		if (m_params.m_debug_stats)
			debug_printf("Total endpoint clusters: %u, parent clusters: %u\n", (uint32_t)m_endpoint_clusters.size(), (uint32_t)m_endpoint_parent_clusters.size());
	}